

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O3

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::set_color
          (ansicolor_sink<spdlog::details::console_mutex> *this,level_enum color_level,
          string_view_t color)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __mutex = (pthread_mutex_t *)this->mutex_;
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,color.data_,color.data_ + color.size_);
  if (color_level < n_levels) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((this->colors_)._M_elems + (int)color_level),&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_out_of_range_fmt
            ("array::at: __n (which is %zu) >= _Nm (which is %zu)",(long)(int)color_level,7);
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_color(level::level_enum color_level,
                                                           string_view_t color) {
    std::lock_guard<mutex_t> lock(mutex_);
    colors_.at(static_cast<size_t>(color_level)) = to_string_(color);
}